

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O3

bool ImGui_ImplGlfwGL3_Init(GLFWwindow *window,bool install_callbacks)

{
  ImGuiContext *pIVar1;
  undefined7 in_register_00000031;
  
  pIVar1 = GImGui;
  g_Window = window;
  (pIVar1->IO).KeyMap[0] = 0x102;
  (pIVar1->IO).KeyMap[1] = 0x107;
  (pIVar1->IO).KeyMap[2] = 0x106;
  (pIVar1->IO).KeyMap[3] = 0x109;
  (pIVar1->IO).KeyMap[4] = 0x108;
  (pIVar1->IO).KeyMap[5] = 0x10a;
  (pIVar1->IO).KeyMap[6] = 0x10b;
  (pIVar1->IO).KeyMap[7] = 0x10c;
  (pIVar1->IO).KeyMap[8] = 0x10d;
  (pIVar1->IO).KeyMap[9] = 0x105;
  (pIVar1->IO).KeyMap[10] = 0x103;
  (pIVar1->IO).KeyMap[0xb] = 0x101;
  (pIVar1->IO).KeyMap[0xc] = 0x100;
  (pIVar1->IO).KeyMap[0xd] = 0x41;
  (pIVar1->IO).KeyMap[0xe] = 0x43;
  (pIVar1->IO).KeyMap[0xf] = 0x56;
  (pIVar1->IO).KeyMap[0x10] = 0x58;
  (pIVar1->IO).KeyMap[0x11] = 0x59;
  (pIVar1->IO).KeyMap[0x12] = 0x5a;
  (pIVar1->IO).RenderDrawListsFn = ImGui_ImplGlfwGL3_RenderDrawLists;
  (pIVar1->IO).SetClipboardTextFn = ImGui_ImplGlfwGL3_SetClipboardText;
  (pIVar1->IO).GetClipboardTextFn = ImGui_ImplGlfwGL3_GetClipboardText;
  if ((int)CONCAT71(in_register_00000031,install_callbacks) != 0) {
    glfwSetMouseButtonCallback(window,ImGui_ImplGlfwGL3_MouseButtonCallback);
    glfwSetScrollCallback(window,ImGui_ImplGlfwGL3_ScrollCallback);
    glfwSetKeyCallback(window,ImGui_ImplGlfwGL3_KeyCallback);
    glfwSetCharCallback(window,ImGui_ImplGlfwGL3_CharCallback);
  }
  return true;
}

Assistant:

bool    ImGui_ImplGlfwGL3_Init(GLFWwindow* window, bool install_callbacks)
{
    g_Window = window;

    ImGuiIO& io = ImGui::GetIO();
    io.KeyMap[ImGuiKey_Tab] = GLFW_KEY_TAB;                         // Keyboard mapping. ImGui will use those indices to peek into the io.KeyDown[] array.
    io.KeyMap[ImGuiKey_LeftArrow] = GLFW_KEY_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = GLFW_KEY_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = GLFW_KEY_UP;
    io.KeyMap[ImGuiKey_DownArrow] = GLFW_KEY_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = GLFW_KEY_PAGE_UP;
    io.KeyMap[ImGuiKey_PageDown] = GLFW_KEY_PAGE_DOWN;
    io.KeyMap[ImGuiKey_Home] = GLFW_KEY_HOME;
    io.KeyMap[ImGuiKey_End] = GLFW_KEY_END;
    io.KeyMap[ImGuiKey_Delete] = GLFW_KEY_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = GLFW_KEY_BACKSPACE;
    io.KeyMap[ImGuiKey_Enter] = GLFW_KEY_ENTER;
    io.KeyMap[ImGuiKey_Escape] = GLFW_KEY_ESCAPE;
    io.KeyMap[ImGuiKey_A] = GLFW_KEY_A;
    io.KeyMap[ImGuiKey_C] = GLFW_KEY_C;
    io.KeyMap[ImGuiKey_V] = GLFW_KEY_V;
    io.KeyMap[ImGuiKey_X] = GLFW_KEY_X;
    io.KeyMap[ImGuiKey_Y] = GLFW_KEY_Y;
    io.KeyMap[ImGuiKey_Z] = GLFW_KEY_Z;

    io.RenderDrawListsFn = ImGui_ImplGlfwGL3_RenderDrawLists;       // Alternatively you can set this to NULL and call ImGui::GetDrawData() after ImGui::Render() to get the same ImDrawData pointer.
    io.SetClipboardTextFn = ImGui_ImplGlfwGL3_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfwGL3_GetClipboardText;
#ifdef _WIN32
    io.ImeWindowHandle = glfwGetWin32Window(g_Window);
#endif

    if (install_callbacks)
    {
        glfwSetMouseButtonCallback(window, ImGui_ImplGlfwGL3_MouseButtonCallback);
        glfwSetScrollCallback(window, ImGui_ImplGlfwGL3_ScrollCallback);
        glfwSetKeyCallback(window, ImGui_ImplGlfwGL3_KeyCallback);
        glfwSetCharCallback(window, ImGui_ImplGlfwGL3_CharCallback);
    }

    return true;
}